

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

void FilterCompactCVars(TArray<FBaseCVar_*,_FBaseCVar_*> *cvars,DWORD filter)

{
  FBaseCVar **ppFVar1;
  uint uVar2;
  FBaseCVar *pFVar3;
  
  pFVar3 = CVars;
  if (CVars != (FBaseCVar *)0x0) {
    do {
      if ((pFVar3->Flags >> 0xe & 1) == 0 && (pFVar3->Flags & filter) != 0) {
        TArray<FBaseCVar_*,_FBaseCVar_*>::Grow(cvars,1);
        uVar2 = cvars->Count;
        cvars->Array[uVar2] = pFVar3;
        cvars->Count = uVar2 + 1;
      }
      ppFVar1 = &pFVar3->m_Next;
      pFVar3 = *ppFVar1;
    } while (*ppFVar1 != (FBaseCVar *)0x0);
  }
  if ((ulong)cvars->Count == 0) {
    return;
  }
  qsort(cvars->Array,(ulong)cvars->Count,8,sortcvars);
  return;
}

Assistant:

void FilterCompactCVars (TArray<FBaseCVar *> &cvars, DWORD filter)
{
	// Accumulate all cvars that match the filter flags.
	for (FBaseCVar *cvar = CVars; cvar != NULL; cvar = cvar->m_Next)
	{
		if ((cvar->Flags & filter) && !(cvar->Flags & CVAR_IGNORE))
			cvars.Push(cvar);
	}
	// Now sort them, so they're in a deterministic order and not whatever
	// order the linker put them in.
	if (cvars.Size() > 0)
	{
		qsort(&cvars[0], cvars.Size(), sizeof(FBaseCVar *), sortcvars);
	}
}